

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O0

int trust_compat(X509_TRUST *trust,X509 *x)

{
  int iVar1;
  X509 *x_local;
  X509_TRUST *trust_local;
  
  iVar1 = x509v3_cache_extensions(x);
  if (iVar1 == 0) {
    trust_local._4_4_ = 3;
  }
  else if ((x->ex_flags & 0x2000) == 0) {
    trust_local._4_4_ = 3;
  }
  else {
    trust_local._4_4_ = 1;
  }
  return trust_local._4_4_;
}

Assistant:

static int trust_compat(const X509_TRUST *trust, X509 *x) {
  if (!x509v3_cache_extensions(x)) {
    return X509_TRUST_UNTRUSTED;
  }
  if (x->ex_flags & EXFLAG_SS) {
    return X509_TRUST_TRUSTED;
  } else {
    return X509_TRUST_UNTRUSTED;
  }
}